

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

ref<aphy::motion_state>
aphy::
makeObjectWithInterface<aphy::motion_state,APhyBullet::BulletMotionState,btDefaultMotionState*>
          (btDefaultMotionState *args)

{
  ref_counter<aphy::motion_state> *this;
  pointer theCounter;
  Counter *in_RDI;
  unique_ptr<aphy::ref_counter<aphy::motion_state>,_std::default_delete<aphy::ref_counter<aphy::motion_state>_>_>
  counter;
  unique_ptr<APhyBullet::BulletMotionState,_std::default_delete<APhyBullet::BulletMotionState>_>
  object;
  pointer in_stack_ffffffffffffffa8;
  BulletMotionState *in_stack_ffffffffffffffb0;
  ref_counter<aphy::motion_state> local_30 [2];
  
  ::operator_new(0x18);
  APhyBullet::BulletMotionState::BulletMotionState
            (in_stack_ffffffffffffffb0,(btMotionState *)in_stack_ffffffffffffffa8);
  std::unique_ptr<APhyBullet::BulletMotionState,std::default_delete<APhyBullet::BulletMotionState>>
  ::unique_ptr<std::default_delete<APhyBullet::BulletMotionState>,void>
            ((unique_ptr<APhyBullet::BulletMotionState,_std::default_delete<APhyBullet::BulletMotionState>_>
              *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this = (ref_counter<aphy::motion_state> *)::operator_new(0x18);
  std::
  unique_ptr<APhyBullet::BulletMotionState,_std::default_delete<APhyBullet::BulletMotionState>_>::
  release((unique_ptr<APhyBullet::BulletMotionState,_std::default_delete<APhyBullet::BulletMotionState>_>
           *)0x12dce6);
  ref_counter<aphy::motion_state>::ref_counter(this,&in_stack_ffffffffffffffa8->super_motion_state);
  std::
  unique_ptr<aphy::ref_counter<aphy::motion_state>,std::default_delete<aphy::ref_counter<aphy::motion_state>>>
  ::unique_ptr<std::default_delete<aphy::ref_counter<aphy::motion_state>>,void>
            ((unique_ptr<aphy::ref_counter<aphy::motion_state>,_std::default_delete<aphy::ref_counter<aphy::motion_state>_>_>
              *)this,local_30);
  theCounter = std::
               unique_ptr<aphy::ref_counter<aphy::motion_state>,_std::default_delete<aphy::ref_counter<aphy::motion_state>_>_>
               ::release((unique_ptr<aphy::ref_counter<aphy::motion_state>,_std::default_delete<aphy::ref_counter<aphy::motion_state>_>_>
                          *)0x12dd11);
  ref<aphy::motion_state>::ref((ref<aphy::motion_state> *)in_RDI,theCounter);
  std::
  unique_ptr<aphy::ref_counter<aphy::motion_state>,_std::default_delete<aphy::ref_counter<aphy::motion_state>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::motion_state>,_std::default_delete<aphy::ref_counter<aphy::motion_state>_>_>
                 *)this);
  std::
  unique_ptr<APhyBullet::BulletMotionState,_std::default_delete<APhyBullet::BulletMotionState>_>::
  ~unique_ptr((unique_ptr<APhyBullet::BulletMotionState,_std::default_delete<APhyBullet::BulletMotionState>_>
               *)this);
  return (ref<aphy::motion_state>)in_RDI;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}